

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_print_exception_op(sexp ctx,sexp self,sexp_sint_t n,sexp exn,sexp out)

{
  char *pcVar1;
  sexp psVar2;
  ulong uVar3;
  sexp psVar4;
  sexp_sint_t extraout_RDX;
  sexp_sint_t extraout_RDX_00;
  sexp_sint_t extraout_RDX_01;
  sexp_sint_t extraout_RDX_02;
  sexp_sint_t extraout_RDX_03;
  sexp_sint_t extraout_RDX_04;
  sexp_sint_t extraout_RDX_05;
  sexp_sint_t extraout_RDX_06;
  sexp_sint_t extraout_RDX_07;
  sexp_sint_t extraout_RDX_08;
  sexp_sint_t extraout_RDX_09;
  sexp_sint_t extraout_RDX_10;
  sexp_sint_t extraout_RDX_11;
  sexp_sint_t sVar5;
  sexp_sint_t extraout_RDX_12;
  char **ppcVar6;
  sexp *ppsVar7;
  sexp local_58;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  
  ppcVar6 = (char **)&local_58;
  local_58 = (sexp)&DAT_0000043e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  tmp = (sexp)&DAT_0000043e;
  __sexp_gc_preserver2.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver2.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)exn & 3) == 0) && (exn->tag == 0x13)) {
    psVar2 = (exn->value).type.name;
    if ((psVar2 == (sexp)(((ctx->value).type.setters)->value).context.mark_stack[4].end) &&
       (psVar4 = (exn->value).type.slots, ((ulong)psVar4 & 3) == 0)) {
      if ((psVar2 == (sexp)0xa3e) || (psVar4->tag == 0x13)) {
LAB_0010d4c8:
        sexp_print_exception_op(ctx,self,n,psVar4,out);
        goto LAB_0010d4b2;
      }
    }
    else if (psVar2 == (sexp)0xa3e) {
      psVar4 = (exn->value).type.slots;
      goto LAB_0010d4c8;
    }
  }
  __sexp_gc_preserver2.next = &__sexp_gc_preserver1;
  __sexp_gc_preserver1.next = (ctx->value).context.saves;
  __sexp_gc_preserver2.var = &tmp;
  (ctx->value).context.saves = &__sexp_gc_preserver2;
  if ((((ulong)out & 3) != 0) || (__sexp_gc_preserver1.var = &local_58, out->tag != 0x11)) {
    __sexp_gc_preserver1.var = &local_58;
    out = sexp_make_output_port(ctx,_stderr,(sexp)&DAT_0000003e);
    tmp = out;
  }
  if ((out->value).type.setters == (sexp)0x0) {
    fputs("ERROR",(FILE *)(out->value).type.getters);
  }
  else {
    sexp_buffered_write_string(ctx,"ERROR",out);
  }
  if ((((ulong)exn & 3) == 0) && (exn->tag == 0x13)) {
    psVar2 = (exn->value).type.getters;
    if (((ulong)psVar2 & 3) == 0 && psVar2 != (sexp)0x0) {
      if (psVar2->tag == 0x1b) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" in ",(FILE *)(out->value).type.getters);
          sVar5 = extraout_RDX_03;
        }
        else {
          sexp_buffered_write_string(ctx," in ",out);
          sVar5 = extraout_RDX_02;
        }
        ppcVar6 = &((exn->value).port.stream)->_IO_read_ptr;
      }
      else {
        if (((psVar2->tag != 0x14) ||
            (local_58 = (sexp)(((psVar2->value).type.name)->value).stack.length,
            local_58 == (sexp)0x0)) ||
           ((((uint)local_58 & 0xf) != 6 && ((((ulong)local_58 & 3) != 0 || (local_58->tag != 7)))))
           ) goto LAB_0010d53d;
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" in ",(FILE *)(out->value).type.getters);
          sVar5 = extraout_RDX_06;
        }
        else {
          sexp_buffered_write_string(ctx," in ",out);
          sVar5 = extraout_RDX;
          ppcVar6 = (char **)&local_58;
        }
      }
      sexp_write_op(ctx,(sexp)0x0,sVar5,(sexp)*ppcVar6,out);
    }
LAB_0010d53d:
    local_58 = (exn->value).type.setters;
    if ((((((ulong)local_58 & 3) != 0 || local_58 == (sexp)0x0) || (local_58->tag != 6)) &&
        (psVar2 = (exn->value).type.getters, ((ulong)psVar2 & 3) == 0 && psVar2 != (sexp)0x0)) &&
       (psVar2->tag == 0x14)) {
      local_58 = (((psVar2->value).type.name)->value).type.slots;
    }
    if (((local_58 != (sexp)0x0) && (((ulong)local_58 & 3) == 0)) && (local_58->tag == 6)) {
      uVar3 = (local_58->value).string.offset;
      if (uVar3 != 0 && (uVar3 & 1) != 0) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" on line ",(FILE *)(out->value).type.getters);
          sVar5 = extraout_RDX_05;
        }
        else {
          sexp_buffered_write_string(ctx," on line ",out);
          sVar5 = extraout_RDX_04;
        }
        sexp_write_op(ctx,(sexp)0x0,sVar5,(local_58->value).type.cpl,out);
      }
      psVar2 = (local_58->value).type.name;
      if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 9)) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" of file ",(FILE *)(out->value).type.getters);
        }
        else {
          sexp_buffered_write_string(ctx," of file ",out);
        }
        psVar2 = (local_58->value).type.name;
        pcVar1 = (((psVar2->value).type.name)->value).flonum_bits + 8 +
                 (long)(psVar2->value).type.cpl;
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(pcVar1,(FILE *)(out->value).type.getters);
        }
        else {
          sexp_buffered_write_string(ctx,pcVar1,out);
        }
      }
    }
    if ((out->value).type.setters == (sexp)0x0) {
      fputs(": ",(FILE *)(out->value).type.getters);
      sVar5 = extraout_RDX_08;
    }
    else {
      sexp_buffered_write_string(ctx,": ",out);
      sVar5 = extraout_RDX_07;
    }
    psVar2 = (exn->value).type.cpl;
    if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 9)) {
      pcVar1 = (((psVar2->value).type.name)->value).flonum_bits + 8 + (long)(psVar2->value).type.cpl
      ;
      if ((out->value).type.setters == (sexp)0x0) {
        fputs(pcVar1,(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string(ctx,pcVar1,out);
      }
    }
    else {
      sexp_write_op(ctx,(sexp)0x0,sVar5,psVar2,out);
    }
    psVar2 = (exn->value).type.slots;
    if ((((ulong)psVar2 & 3) != 0 || psVar2 == (sexp)0x0) || (psVar2->tag != 6)) goto LAB_0010d469;
    ppsVar7 = &(exn->value).type.slots;
    psVar4 = (out->value).type.setters;
    if ((psVar2->value).type.cpl == (sexp)0x23e) {
      if (psVar4 == (sexp)0x0) {
        fputs(": ",(FILE *)(out->value).type.getters);
        sVar5 = extraout_RDX_12;
      }
      else {
        sexp_buffered_write_string(ctx,": ",out);
        sVar5 = extraout_RDX_09;
      }
      sexp_write_op(ctx,(sexp)0x0,sVar5,((*ppsVar7)->value).type.name,out);
      if ((out->value).type.setters == (sexp)0x0) {
        fputs("\n",(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string(ctx,"\n",out);
      }
    }
    else {
      if (psVar4 == (sexp)0x0) {
        fputs("\n",(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string(ctx,"\n",out);
      }
      while ((local_58 = *ppsVar7, ((ulong)local_58 & 3) == 0 && (local_58->tag == 6))) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs("    ",(FILE *)(out->value).type.getters);
          sVar5 = extraout_RDX_11;
        }
        else {
          sexp_buffered_write_string(ctx,"    ",out);
          sVar5 = extraout_RDX_10;
        }
        sexp_write_op(ctx,(sexp)0x0,sVar5,(local_58->value).type.name,out);
        psVar2 = (out->value).type.setters;
        if (psVar2 == (sexp)0x0) {
          putc(10,(FILE *)(out->value).type.getters);
        }
        else {
          psVar4 = (out->value).type.print;
          if (psVar4 < (sexp)(out->value).port.size) {
            (out->value).type.print = (sexp)((long)&psVar4->tag + 1);
            *(undefined1 *)((long)&psVar4->tag + (long)&psVar2->tag) = 10;
          }
          else {
            sexp_buffered_write_char(ctx,10,out);
          }
        }
        ppsVar7 = &(local_58->value).type.cpl;
      }
    }
  }
  else {
    if ((out->value).type.setters == (sexp)0x0) {
      fputs(": ",(FILE *)(out->value).type.getters);
      sVar5 = extraout_RDX_01;
    }
    else {
      sexp_buffered_write_string(ctx,": ",out);
      sVar5 = extraout_RDX_00;
    }
    if ((((ulong)exn & 3) == 0) && (exn->tag == 9)) {
      pcVar1 = (((exn->value).type.name)->value).flonum_bits + 8 + (long)(exn->value).type.cpl;
      if ((out->value).type.setters == (sexp)0x0) {
        fputs(pcVar1,(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string(ctx,pcVar1,out);
      }
    }
    else {
      sexp_write_op(ctx,(sexp)0x0,sVar5,exn,out);
    }
LAB_0010d469:
    psVar2 = (out->value).type.setters;
    if (psVar2 == (sexp)0x0) {
      putc(10,(FILE *)(out->value).type.getters);
    }
    else {
      psVar4 = (out->value).type.print;
      if (psVar4 < (sexp)(out->value).port.size) {
        (out->value).type.print = (sexp)((long)&psVar4->tag + 1);
        *(undefined1 *)((long)&psVar4->tag + (long)&psVar2->tag) = 10;
      }
      else {
        sexp_buffered_write_char(ctx,10,out);
      }
    }
  }
  (ctx->value).context.saves = __sexp_gc_preserver1.next;
LAB_0010d4b2:
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_print_exception_op (sexp ctx, sexp self, sexp_sint_t n, sexp exn, sexp out) {
  sexp_gc_var2(ls, tmp);
  /* unwrap continuable exceptions */
  if (sexp_exceptionp(exn)
      && ((sexp_exception_kind(exn) == sexp_global(ctx, SEXP_G_CONTINUABLE_SYMBOL)
           && sexp_exceptionp(sexp_exception_irritants(exn)))
          || sexp_exception_kind(exn) == SEXP_UNCAUGHT)) {
    return sexp_print_exception_op(ctx, self, n, sexp_exception_irritants(exn), out);
  }
  sexp_gc_preserve2(ctx, ls, tmp);
  if (! sexp_oportp(out))
    out = tmp = sexp_make_output_port(ctx, stderr, SEXP_FALSE);
  sexp_write_string(ctx, "ERROR", out);
  if (sexp_exceptionp(exn)) {
    if (sexp_exception_procedure(exn)) {
      if (sexp_procedurep(sexp_exception_procedure(exn))) {
        ls = sexp_bytecode_name(
              sexp_procedure_code(sexp_exception_procedure(exn)));
        if (ls && sexp_symbolp(ls)) {
          sexp_write_string(ctx, " in ", out);
          sexp_write(ctx, ls, out);
        }
      } else if (sexp_opcodep(sexp_exception_procedure(exn))) {
        sexp_write_string(ctx, " in ", out);
        sexp_write(ctx, sexp_opcode_name(sexp_exception_procedure(exn)), out);
      }
    }
    ls = sexp_exception_source(exn);
    if ((! (ls && sexp_pairp(ls)))
        && sexp_exception_procedure(exn)
        && sexp_procedurep(sexp_exception_procedure(exn)))
      ls = sexp_bytecode_source(sexp_procedure_code(sexp_exception_procedure(exn)));
    if (ls && sexp_pairp(ls)) {
      if (sexp_fixnump(sexp_cdr(ls)) && (sexp_cdr(ls) >= SEXP_ZERO)) {
        sexp_write_string(ctx, " on line ", out);
        sexp_write(ctx, sexp_cdr(ls), out);
      }
      if (sexp_stringp(sexp_car(ls))) {
        sexp_write_string(ctx, " of file ", out);
        sexp_write_string(ctx, sexp_string_data(sexp_car(ls)), out);
      }
    }
    sexp_write_string(ctx, ": ", out);
    if (sexp_stringp(sexp_exception_message(exn)))
      sexp_write_string(ctx, sexp_string_data(sexp_exception_message(exn)), out);
    else
      sexp_write(ctx, sexp_exception_message(exn), out);
    if (sexp_exception_irritants(exn)
        && sexp_pairp(sexp_exception_irritants(exn))) {
      if (sexp_nullp(sexp_cdr(sexp_exception_irritants(exn)))) {
        sexp_write_string(ctx, ": ", out);
        sexp_write(ctx, sexp_car(sexp_exception_irritants(exn)), out);
        sexp_write_string(ctx, "\n", out);
      } else {
        sexp_write_string(ctx, "\n", out);
        for (ls=sexp_exception_irritants(exn);
             sexp_pairp(ls); ls=sexp_cdr(ls)) {
          sexp_write_string(ctx, "    ", out);
          sexp_write(ctx, sexp_car(ls), out);
          sexp_write_char(ctx, '\n', out);
        }
      }
    } else {
      sexp_write_char(ctx, '\n', out);
    }
  } else {
    sexp_write_string(ctx, ": ", out);
    if (sexp_stringp(exn))
      sexp_write_string(ctx, sexp_string_data(exn), out);
    else
      sexp_write(ctx, exn, out);
    sexp_write_char(ctx, '\n', out);
  }
  sexp_gc_release2(ctx);
  return SEXP_VOID;
}